

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O1

Vec<Hpipe::CharItem_*> * __thiscall
Hpipe::Vec<Hpipe::CharItem_*>::operator<<(Vec<Hpipe::CharItem_*> *this,CharItem **val)

{
  pointer *pppCVar1;
  iterator __position;
  
  __position._M_current =
       (this->super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>).
       super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>).
      super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>>::
    _M_realloc_insert<Hpipe::CharItem*const&>
              ((vector<Hpipe::CharItem*,std::allocator<Hpipe::CharItem*>> *)this,__position,val);
  }
  else {
    *__position._M_current = *val;
    pppCVar1 = &(this->super_vector<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>).
                super__Vector_base<Hpipe::CharItem_*,_std::allocator<Hpipe::CharItem_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return this;
}

Assistant:

Vec     &operator<<           ( const T &val ) { this->emplace_back( val ); return *this; }